

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxseparate.cpp
# Opt level: O0

int32_t main(int32_t argc,char **argv)

{
  char *pcVar1;
  char *ext;
  char output_filename [1024];
  undefined1 local_4640 [8];
  ogt_vox_scene output_scene;
  ogt_vox_model *local_1c0;
  ogt_vox_instance instance;
  char tmp_model_name [64];
  uint32_t *puStack_100;
  uint32_t instance_index;
  char *model_name;
  ogt_vox_model *model;
  ogt_vox_scene *poStack_e8;
  uint32_t model_index;
  ogt_vox_scene *scene;
  char *input_filename;
  undefined1 local_d0 [4];
  int32_t input_index;
  undefined1 local_90 [8];
  ogt_vox_group default_group;
  ogt_vox_layer default_layer;
  char **argv_local;
  int32_t argc_local;
  
  if (argc < 2) {
    printf("ERROR: no input files were provided on the command-line\n");
    print_help();
    argv_local._4_4_ = 3;
  }
  else {
    memset(&default_group.transform_anim.num_keyframes,0,0x10);
    default_group.transform_anim._8_8_ = anon_var_dwarf_f98;
    memset(local_90,0,0x68);
    default_group.parent_group_index._0_1_ = 0;
    default_group.transform.m33 = 0.0;
    default_group.transform.m32 = -NAN;
    ogt_vox_transform_get_identity();
    memcpy(&default_group,local_d0,0x40);
    for (input_filename._4_4_ = 1; input_filename._4_4_ < argc;
        input_filename._4_4_ = input_filename._4_4_ + 1) {
      scene = (ogt_vox_scene *)argv[input_filename._4_4_];
      pcVar1 = strstr((char *)scene,".vox");
      if (pcVar1 == (char *)0x0) {
        printf("ERROR: input \'%s\' specified does not have .vox extension.\n",scene);
        return 4;
      }
      printf("processing input %s\n");
      poStack_e8 = load_vox_scene((char *)scene,0);
      if (poStack_e8 == (ogt_vox_scene *)0x0) {
        printf("ERROR: could not load scene with name \'%s\'\n",scene);
        return 5;
      }
      for (model._4_4_ = 0; model._4_4_ < poStack_e8->num_models; model._4_4_ = model._4_4_ + 1) {
        model_name = (char *)poStack_e8->models[model._4_4_];
        puStack_100 = (uint32_t *)0x0;
        tmp_model_name[0x3c] = '\0';
        tmp_model_name[0x3d] = '\0';
        tmp_model_name[0x3e] = '\0';
        tmp_model_name[0x3f] = '\0';
        for (; (uint)tmp_model_name._60_4_ < poStack_e8->num_instances;
            tmp_model_name._60_4_ = tmp_model_name._60_4_ + 1) {
          if ((poStack_e8->instances[(uint)tmp_model_name._60_4_].name != (char *)0x0) &&
             (poStack_e8->instances[(uint)tmp_model_name._60_4_].model_index == model._4_4_)) {
            if (puStack_100 == (uint32_t *)0x0) {
              puStack_100 = (uint32_t *)poStack_e8->instances[(uint)tmp_model_name._60_4_].name;
            }
            else {
              printf("WARNING: model %i has been given name %s but there is also an instance of this model with name %s."
                     ,(ulong)model._4_4_,puStack_100,
                     poStack_e8->instances[(uint)tmp_model_name._60_4_].name);
            }
          }
        }
        memset(&instance.model_anim.num_keyframes,0,0x40);
        if (puStack_100 == (uint32_t *)0x0) {
          puStack_100 = &instance.model_anim.num_keyframes;
          sprintf((char *)&instance.model_anim.num_keyframes,"model%i",(ulong)model._4_4_);
        }
        memset(&local_1c0,0,0x78);
        instance.model_index = 0;
        instance.layer_index._0_1_ = 0;
        instance.transform.m33 = 0.0;
        instance.transform.m32 = 0.0;
        local_1c0 = (ogt_vox_model *)0x0;
        ogt_vox_transform_get_identity();
        memcpy(&instance,&output_scene.cameras,0x40);
        memset(local_4640,0,0x4440);
        output_scene.layers = (ogt_vox_layer *)local_90;
        output_scene.num_instances = 1;
        local_4640._4_4_ = 1;
        output_scene.models = &local_1c0;
        output_scene.num_models = 1;
        output_scene.instances = (ogt_vox_instance *)&default_group.transform_anim.num_keyframes;
        local_4640._0_4_ = 1;
        output_scene._8_8_ = &model_name;
        memcpy(&output_scene.groups,&poStack_e8->palette,0x400);
        strcpy((char *)&ext,(char *)scene);
        pcVar1 = strstr((char *)&ext,".");
        *pcVar1 = '\0';
        strcat((char *)&ext,"-");
        strcat((char *)&ext,(char *)puStack_100);
        strcat((char *)&ext,".vox");
        save_vox_scene((char *)&ext,(ogt_vox_scene *)local_4640);
      }
      ogt_vox_destroy_scene(poStack_e8);
    }
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int32_t main(int32_t argc, char** argv) {
    // validate we have at least one input file provided on command-line.
    if (argc <= 1) {
        printf("ERROR: no input files were provided on the command-line\n");
        print_help();
        return 3;
    }

    ogt_vox_layer default_layer = {};
    default_layer.hidden = false;
    default_layer.name = "default";

    ogt_vox_group default_group = {};
    default_group.hidden = false;
    default_group.layer_index = 0;
    default_group.parent_group_index = k_invalid_group_index;
    default_group.transform = ogt_vox_transform_get_identity();

    // process all input files specified
    for (int32_t input_index = 1; input_index < argc; input_index++) {
        const char* input_filename = argv[input_index];
        if (!strstr(input_filename, ".vox")) {
            printf("ERROR: input '%s' specified does not have .vox extension.\n", input_filename);
            return 4;
        }
        printf("processing input %s\n", input_filename);

        // load scene
        const ogt_vox_scene* scene = load_vox_scene(input_filename);
        if (!scene) {
            printf("ERROR: could not load scene with name '%s'\n", input_filename);
            return 5;
        }

        // determine which models we're going to write to the FBX file.
        for (uint32_t model_index = 0; model_index < scene->num_models; model_index++) {
            const ogt_vox_model* model = scene->models[model_index];

            // find the model name by finding a named instance that references it.
            const char* model_name = NULL;
            for (uint32_t instance_index = 0; instance_index < scene->num_instances; instance_index++) {
                if (scene->instances[instance_index].name && scene->instances[instance_index].model_index == model_index) {
                    if (!model_name) {
                        model_name = scene->instances[instance_index].name;
                    }
                    else {
                        // warn if there are multiple instances of the same model with different names causing ambiguity (a .vox author could do this without knowing).
                        printf("WARNING: model %i has been given name %s but there is also an instance of this model with name %s.", model_index, model_name, scene->instances[instance_index].name);
                    }
                }
            }

            // if there is no model name, we either skip the export of this model (if --named-models-only was specified ) or give it an autogenerated name
            char tmp_model_name[64] = {};
            if (!model_name) {
                // otherwise, autogenerate a name for the model based on its index in the vox file.
                model_name = tmp_model_name;
                sprintf_s(tmp_model_name, "model%i", model_index);
            }

            // construct the scene with a single instance referencing this model
            ogt_vox_instance instance = {};
            instance.group_index = 0;   // default_group
            instance.hidden      = false;
            instance.layer_index = 0;   // default_layer
            instance.model_index = 0;
            instance.name        = NULL;
            instance.transform   = ogt_vox_transform_get_identity();

            ogt_vox_scene output_scene = {};
            output_scene.groups        = &default_group;
            output_scene.num_groups    = 1;
            output_scene.instances     = &instance;
            output_scene.num_instances = 1;
            output_scene.instances     = &instance;
            output_scene.num_layers    = 1;
            output_scene.layers        = &default_layer;
            output_scene.num_models    = 1;
            output_scene.models        = &model;
            output_scene.palette       = scene->palette;

            // construct the output filename for this model.
            char output_filename[1024];
            strcpy_s(output_filename, input_filename);
            char* ext = strstr(output_filename, ".");
            *ext = 0;
            strcat_s(output_filename, "-");
            strcat_s(output_filename, model_name);
            strcat_s(output_filename, ".vox");

            save_vox_scene(output_filename, &output_scene);
        }

        ogt_vox_destroy_scene(scene);
    }

    return 0;
}